

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdpp.c
# Opt level: O0

MPP_RET vdpp_init(VdppCtx *ictx)

{
  int iVar1;
  undefined8 in_R9;
  int *piVar2;
  vdpp_api_ctx *ctx;
  undefined4 local_38;
  RK_U32 client_data;
  MppReqV1 mpp_req;
  MPP_RET ret;
  VdppCtx *ictx_local;
  
  ctx._4_4_ = 0x1d;
  if (*ictx == (VdppCtx)0x0) {
    _mpp_log_l(2,"vdpp","found NULL input vdpp ctx %p\n","vdpp_init",*ictx,in_R9,0);
    ictx_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else {
    piVar2 = (int *)*ictx;
    mpp_env_get_u32("vdpp_debug",&vdpp_debug,0);
    iVar1 = open("/dev/mpp_service",0x80002);
    *piVar2 = iVar1;
    if (*piVar2 < 0) {
      _mpp_log_l(2,"vdpp","can NOT find device /dev/vdpp\n",(char *)0x0);
      ictx_local._4_4_ = MPP_NOK;
    }
    else {
      local_38 = 0x100;
      client_data = 0;
      mpp_req.cmd = 4;
      mpp_req._8_8_ = (long)&ctx + 4;
      memset(piVar2 + 2,0,0x100);
      vdpp_set_default_param((vdpp_params_conflict *)(piVar2 + 2));
      mpp_req.data_ptr._4_4_ = ioctl(*piVar2,0x40047601,&local_38);
      if (mpp_req.data_ptr._4_4_ == 0) {
        ictx_local._4_4_ = MPP_OK;
      }
      else {
        _mpp_log_l(2,"vdpp","ioctl set_client failed\n",(char *)0x0);
        ictx_local._4_4_ = MPP_NOK;
      }
    }
  }
  return ictx_local._4_4_;
}

Assistant:

MPP_RET vdpp_init(VdppCtx *ictx)
{
    MPP_RET ret;
    MppReqV1 mpp_req;
    RK_U32 client_data = VDPP_CLIENT_TYPE;
    struct vdpp_api_ctx *ctx = NULL;

    if (NULL == *ictx) {
        mpp_err_f("found NULL input vdpp ctx %p\n", *ictx);
        return MPP_ERR_NULL_PTR;
    }

    ctx = *ictx;

    mpp_env_get_u32("vdpp_debug", &vdpp_debug, 0);

    ctx->fd = open("/dev/mpp_service", O_RDWR | O_CLOEXEC);
    if (ctx->fd < 0) {
        mpp_err("can NOT find device /dev/vdpp\n");
        return MPP_NOK;
    }

    mpp_req.cmd = MPP_CMD_INIT_CLIENT_TYPE;
    mpp_req.flag = 0;
    mpp_req.size = sizeof(client_data);
    mpp_req.data_ptr = REQ_DATA_PTR(&client_data);

    memset(&ctx->params, 0, sizeof(struct vdpp_params));
    /* set default parameters */
    vdpp_set_default_param(&ctx->params);

    ret = (RK_S32)ioctl(ctx->fd, MPP_IOC_CFG_V1, &mpp_req);
    if (ret) {
        mpp_err("ioctl set_client failed\n");
        return MPP_NOK;
    }

    return MPP_OK;
}